

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O0

bool InitHTTPAllowList(void)

{
  long lVar1;
  string_view logging_function;
  char cVar2;
  bool bVar3;
  undefined1 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  CNetAddr *__s;
  iterator iVar5;
  long in_FS_OFFSET;
  CSubNet *subnet_1;
  vector<CSubNet,_std::allocator<CSubNet>_> *__range1_1;
  string *strAllow;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  iterator __end1_1;
  iterator __begin1_1;
  iterator __end1;
  iterator __begin1;
  string strAllowed;
  CSubNet subnet;
  undefined4 in_stack_fffffffffffffc88;
  uint in_stack_fffffffffffffc8c;
  value_type *in_stack_fffffffffffffc90;
  bilingual_str *in_stack_fffffffffffffc98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca0;
  undefined6 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcae;
  undefined1 in_stack_fffffffffffffcaf;
  undefined7 in_stack_fffffffffffffcc0;
  DNSLookupFn *in_stack_fffffffffffffcc8;
  allocator<char> *__a;
  char *in_stack_fffffffffffffcd0;
  string *in_stack_fffffffffffffcd8;
  CSubNet *this;
  bilingual_str *fmt;
  reference in_stack_fffffffffffffcf8;
  int source_line;
  ArgsManager *in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd20;
  byte local_2c9;
  ConstevalFormatString<1U> in_stack_fffffffffffffd38;
  string_view in_stack_fffffffffffffd40;
  size_t in_stack_fffffffffffffd50;
  allocator<char> local_292;
  allocator<char> local_291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  allocator<char> local_279 [60];
  undefined1 local_23d [109];
  Level in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CSubNet,_std::allocator<CSubNet>_>::clear
            ((vector<CSubNet,_std::allocator<CSubNet>_> *)
             CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  fmt = (bilingual_str *)(local_23d + 0x2c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
             (allocator<char> *)in_stack_fffffffffffffcc8);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)CONCAT17(in_stack_fffffffffffffcaf,
                         CONCAT16(in_stack_fffffffffffffcae,in_stack_fffffffffffffca8)),
             (function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)in_stack_fffffffffffffca0);
  LookupHost(in_stack_fffffffffffffcd8,SUB81((ulong)in_stack_fffffffffffffcd0 >> 0x38,0),
             in_stack_fffffffffffffcc8);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::optional<CNetAddr>::value((optional<CNetAddr> *)in_stack_fffffffffffffc98);
  local_23d._1_4_ = 8;
  std::vector<CSubNet,std::allocator<CSubNet>>::emplace_back<CNetAddr,int>
            ((vector<CSubNet,_std::allocator<CSubNet>_> *)
             CONCAT17(in_stack_fffffffffffffcaf,
                      CONCAT16(in_stack_fffffffffffffcae,in_stack_fffffffffffffca8)),
             (CNetAddr *)in_stack_fffffffffffffca0,(int *)in_stack_fffffffffffffc98);
  std::optional<CNetAddr>::~optional
            ((optional<CNetAddr> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
               *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  std::allocator<char>::~allocator((allocator<char> *)(local_23d + 0x2c));
  this = (CSubNet *)local_23d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             in_stack_fffffffffffffcd0,(allocator<char> *)in_stack_fffffffffffffcc8);
  uVar4 = (undefined1)((ulong)in_stack_fffffffffffffcd0 >> 0x38);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)CONCAT17(in_stack_fffffffffffffcaf,
                         CONCAT16(in_stack_fffffffffffffcae,in_stack_fffffffffffffca8)),
             (function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)in_stack_fffffffffffffca0);
  LookupHost((string *)this,(bool)uVar4,in_stack_fffffffffffffcc8);
  __s = std::optional<CNetAddr>::value((optional<CNetAddr> *)in_stack_fffffffffffffc98);
  std::vector<CSubNet,_std::allocator<CSubNet>_>::emplace_back<CNetAddr>
            ((vector<CSubNet,_std::allocator<CSubNet>_> *)
             CONCAT17(in_stack_fffffffffffffcaf,
                      CONCAT16(in_stack_fffffffffffffcae,in_stack_fffffffffffffca8)),
             (CNetAddr *)in_stack_fffffffffffffca0);
  std::optional<CNetAddr>::~optional
            ((optional<CNetAddr> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
               *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  std::allocator<char>::~allocator((allocator<char> *)local_23d);
  __a = local_279;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,(char *)__s,
             __a);
  ArgsManager::GetArgs(in_stack_fffffffffffffd00,(string *)in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  std::allocator<char>::~allocator(local_279);
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffc90);
  local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffc90);
  while (bVar3 = __gnu_cxx::
                 operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffc98,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffc90), ((bVar3 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    LookupSubNet(in_stack_fffffffffffffd20);
    bVar3 = CSubNet::IsValid((CSubNet *)
                             CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    if (bVar3) {
      std::vector<CSubNet,_std::allocator<CSubNet>_>::push_back
                ((vector<CSubNet,_std::allocator<CSubNet>_> *)in_stack_fffffffffffffc98,
                 in_stack_fffffffffffffc90);
    }
    else {
      uVar4 = bVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)__s,__a);
      Untranslated((string *)CONCAT17(uVar4,in_stack_fffffffffffffcc0));
      tinyformat::format<std::__cxx11::string>(fmt,args);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)__s,__a);
      CClientUIInterface::ThreadSafeMessageBox
                ((CClientUIInterface *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                 (string *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      std::allocator<char>::~allocator(&local_292);
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      std::allocator<char>::~allocator(&local_291);
      local_2c9 = 0;
    }
    cVar2 = !bVar3;
    CSubNet::~CSubNet((CSubNet *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    if ((bool)cVar2) goto LAB_008f2e06;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  }
  cVar2 = '\x02';
LAB_008f2e06:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc98);
  if (cVar2 != '\x01') {
    std::__cxx11::string::string(in_stack_fffffffffffffca0);
    std::vector<CSubNet,_std::allocator<CSubNet>_>::begin
              ((vector<CSubNet,_std::allocator<CSubNet>_> *)in_stack_fffffffffffffc90);
    iVar5 = std::vector<CSubNet,_std::allocator<CSubNet>_>::end
                      ((vector<CSubNet,_std::allocator<CSubNet>_> *)in_stack_fffffffffffffc90);
    while( true ) {
      source_line = (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
      bVar3 = __gnu_cxx::operator==<CSubNet_*,_std::vector<CSubNet,_std::allocator<CSubNet>_>_>
                        ((__normal_iterator<CSubNet_*,_std::vector<CSubNet,_std::allocator<CSubNet>_>_>
                          *)in_stack_fffffffffffffc98,
                         (__normal_iterator<CSubNet_*,_std::vector<CSubNet,_std::allocator<CSubNet>_>_>
                          *)in_stack_fffffffffffffc90);
      if (((bVar3 ^ 0xffU) & 1) == 0) break;
      in_stack_fffffffffffffcf8 =
           __gnu_cxx::__normal_iterator<CSubNet_*,_std::vector<CSubNet,_std::allocator<CSubNet>_>_>
           ::operator*((__normal_iterator<CSubNet_*,_std::vector<CSubNet,_std::allocator<CSubNet>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      CSubNet::ToString_abi_cxx11_(this);
      std::operator+(in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (&in_stack_fffffffffffffc98->original,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc90);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      __gnu_cxx::__normal_iterator<CSubNet_*,_std::vector<CSubNet,_std::allocator<CSubNet>_>_>::
      operator++((__normal_iterator<CSubNet_*,_std::vector<CSubNet,_std::allocator<CSubNet>_>_> *)
                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    }
    uVar4 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),Trace);
    if ((bool)uVar4) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffcae,in_stack_fffffffffffffca8)),
                 (char *)in_stack_fffffffffffffca0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffcae,in_stack_fffffffffffffca8)),
                 (char *)in_stack_fffffffffffffca0);
      in_stack_fffffffffffffc88 = 1;
      logging_function._M_str = (char *)iVar5._M_current;
      logging_function._M_len = in_stack_fffffffffffffd50;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,in_stack_fffffffffffffd40,source_line,0x111d0a9,
                 in_stack_fffffffffffffe30,in_stack_fffffffffffffd38,in_stack_fffffffffffffe40);
    }
    local_2c9 = 1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_2c9 & 1);
}

Assistant:

static bool InitHTTPAllowList()
{
    rpc_allow_subnets.clear();
    rpc_allow_subnets.emplace_back(LookupHost("127.0.0.1", false).value(), 8);  // always allow IPv4 local subnet
    rpc_allow_subnets.emplace_back(LookupHost("::1", false).value());  // always allow IPv6 localhost
    for (const std::string& strAllow : gArgs.GetArgs("-rpcallowip")) {
        const CSubNet subnet{LookupSubNet(strAllow)};
        if (!subnet.IsValid()) {
            uiInterface.ThreadSafeMessageBox(
                strprintf(Untranslated("Invalid -rpcallowip subnet specification: %s. Valid are a single IP (e.g. 1.2.3.4), a network/netmask (e.g. 1.2.3.4/255.255.255.0) or a network/CIDR (e.g. 1.2.3.4/24)."), strAllow),
                "", CClientUIInterface::MSG_ERROR);
            return false;
        }
        rpc_allow_subnets.push_back(subnet);
    }
    std::string strAllowed;
    for (const CSubNet& subnet : rpc_allow_subnets)
        strAllowed += subnet.ToString() + " ";
    LogDebug(BCLog::HTTP, "Allowing HTTP connections from: %s\n", strAllowed);
    return true;
}